

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O0

float orient3d(float *pa,float *pb,float *pc,float *pd)

{
  float fVar1;
  float fVar2;
  float local_bc;
  float local_b4;
  float local_ac;
  float local_a4;
  float local_9c;
  float local_94;
  float local_8c;
  float local_84;
  float local_7c;
  float errbound;
  float permanent;
  float det;
  float bdxady;
  float adxbdy;
  float adxcdy;
  float cdxady;
  float cdxbdy;
  float bdxcdy;
  float cdz;
  float bdz;
  float adz;
  float cdy;
  float bdy;
  float ady;
  float cdx;
  float bdx;
  float adx;
  float *pd_local;
  float *pc_local;
  float *pb_local;
  float *pa_local;
  
  local_8c = pa[2] - pd[2];
  local_a4 = pb[2] - pd[2];
  local_bc = pc[2] - pd[2];
  local_7c = (*pb - *pd) * (pc[1] - pd[1]);
  local_84 = (*pc - *pd) * (pb[1] - pd[1]);
  local_94 = (*pc - *pd) * (pa[1] - pd[1]);
  local_9c = (*pa - *pd) * (pc[1] - pd[1]);
  local_ac = (*pa - *pd) * (pb[1] - pd[1]);
  local_b4 = (*pb - *pd) * (pa[1] - pd[1]);
  pa_local._4_4_ =
       local_bc * (local_ac - local_b4) +
       local_8c * (local_7c - local_84) + local_a4 * (local_94 - local_9c);
  if (local_7c < 0.0) {
    local_7c = -local_7c;
  }
  if (local_84 < 0.0) {
    local_84 = -local_84;
  }
  if (local_8c < 0.0) {
    local_8c = -local_8c;
  }
  if (local_94 < 0.0) {
    local_94 = -local_94;
  }
  if (local_9c < 0.0) {
    local_9c = -local_9c;
  }
  if (local_a4 < 0.0) {
    local_a4 = -local_a4;
  }
  if (local_ac < 0.0) {
    local_ac = -local_ac;
  }
  if (local_b4 < 0.0) {
    local_b4 = -local_b4;
  }
  if (local_bc < 0.0) {
    local_bc = -local_bc;
  }
  fVar1 = (local_ac + local_b4) * local_bc +
          (local_7c + local_84) * local_8c + (local_94 + local_9c) * local_a4;
  fVar2 = o3derrboundA * fVar1;
  if ((pa_local._4_4_ <= fVar2) && (-pa_local._4_4_ <= fVar2)) {
    pa_local._4_4_ = orient3dadapt(pa,pb,pc,pd,SUB84((double)fVar1,0));
  }
  return pa_local._4_4_;
}

Assistant:

REAL orient3d(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL det;
  REAL permanent, errbound;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];
  adz = pa[2] - pd[2];
  bdz = pb[2] - pd[2];
  cdz = pc[2] - pd[2];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;

  det = adz * (bdxcdy - cdxbdy)
      + bdz * (cdxady - adxcdy)
      + cdz * (adxbdy - bdxady);

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * Absolute(adz)
            + (Absolute(cdxady) + Absolute(adxcdy)) * Absolute(bdz)
            + (Absolute(adxbdy) + Absolute(bdxady)) * Absolute(cdz);
  errbound = o3derrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return orient3dadapt(pa, pb, pc, pd, permanent);
}